

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::remove
          (QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *this,char *__filename)

{
  QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *extraout_RAX;
  long in_RDX;
  qsizetype unaff_retaddr;
  ModelInfo *in_stack_00000008;
  QGenericArrayOps<QConcatenateTablesProxyModelPrivate::ModelInfo> *in_stack_00000010;
  QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo>::detach
              (&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo>::operator->(&this->d);
    QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo>::operator->(&this->d);
    QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo>::begin
              ((QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo> *)0x864df9);
    QtPrivate::QGenericArrayOps<QConcatenateTablesProxyModelPrivate::ModelInfo>::erase
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}